

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall kj::UnixEventPort::gotSignal(UnixEventPort *this,siginfo_t *siginfo)

{
  ChildSet *this_00;
  PromiseFulfiller<siginfo_t> *pPVar1;
  SignalPromiseAdapter *pSVar2;
  SignalPromiseAdapter **ppSVar3;
  SignalPromiseAdapter *pSVar4;
  SignalPromiseAdapter ***pppSVar5;
  long lVar6;
  siginfo_t *psVar7;
  undefined8 *puVar8;
  byte bVar9;
  undefined8 auStack_98 [16];
  
  bVar9 = 0;
  this_00 = (this->childSet).ptr.ptr;
  if ((this_00 != (ChildSet *)0x0) && (siginfo->si_signo == 0x11)) {
    ChildSet::checkExits(this_00);
    return;
  }
  pSVar4 = this->signalHead;
  while (pSVar4 != (SignalPromiseAdapter *)0x0) {
    if (pSVar4->signum == siginfo->si_signo) {
      pPVar1 = pSVar4->fulfiller;
      psVar7 = siginfo;
      puVar8 = auStack_98;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *(undefined8 *)psVar7;
        psVar7 = (siginfo_t *)((long)psVar7 + (ulong)bVar9 * -0x10 + 8);
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,auStack_98);
      pSVar2 = pSVar4->next;
      ppSVar3 = pSVar4->prev;
      pppSVar5 = &pSVar4->loop->signalTail;
      if (pSVar2 != (SignalPromiseAdapter *)0x0) {
        pppSVar5 = &pSVar2->prev;
      }
      *pppSVar5 = ppSVar3;
      *ppSVar3 = pSVar2;
      pSVar4->next = (SignalPromiseAdapter *)0x0;
      pSVar4->prev = (SignalPromiseAdapter **)0x0;
      pSVar4 = pSVar2;
    }
    else {
      pSVar4 = pSVar4->next;
    }
  }
  return;
}

Assistant:

void UnixEventPort::gotSignal(const siginfo_t& siginfo) {
  // If onChildExit() has been called and this is SIGCHLD, check for child exits.
  KJ_IF_MAYBE(cs, childSet) {
    if (siginfo.si_signo == SIGCHLD) {
      cs->get()->checkExits();
      return;
    }
  }

  // Fire any events waiting on this signal.
  auto ptr = signalHead;
  while (ptr != nullptr) {
    if (ptr->signum == siginfo.si_signo) {
      ptr->fulfiller.fulfill(kj::cp(siginfo));
      ptr = ptr->removeFromList();
    } else {
      ptr = ptr->next;
    }
  }
}